

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anonymizer.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *__s;
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  pointer psVar4;
  __type local_195;
  allocator<char> local_149;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  byte local_121;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  reference local_100;
  unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_> *section;
  iterator __end1;
  iterator __begin1;
  Sections *__range1;
  undefined1 local_d8 [8];
  elfio reader;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string filename;
  char **argv_local;
  int argc_local;
  
  filename.field_2._8_8_ = argv;
  if (argc == 2) {
    __s = argv[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_38,__s,&local_39);
    std::allocator<char>::~allocator(&local_39);
    ELFIO::elfio::elfio((elfio *)local_d8);
    bVar1 = ELFIO::elfio::load((elfio *)local_d8,(string *)local_38,false);
    if (bVar1) {
      __end1 = ELFIO::elfio::Sections::begin((Sections *)local_d8);
      section = (unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_> *)
                ELFIO::elfio::Sections::end((Sections *)local_d8);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end1,(__normal_iterator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_*,_std::vector<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>_>
                                         *)&section), bVar1) {
        local_100 = __gnu_cxx::
                    __normal_iterator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_*,_std::vector<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>_>
                    ::operator*(&__end1);
        psVar4 = std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>::operator->
                           (local_100);
        local_121 = 0;
        iVar2 = (*psVar4->_vptr_section[5])();
        local_195 = false;
        if (iVar2 == 3) {
          psVar4 = std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>::operator->
                             (local_100);
          (*psVar4->_vptr_section[3])(&local_120);
          local_121 = 1;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_148,".strtab",&local_149);
          local_195 = std::operator==(&local_120,&local_148);
          std::__cxx11::string::~string((string *)&local_148);
          std::allocator<char>::~allocator(&local_149);
        }
        if ((local_121 & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_120);
        }
        if (local_195 != false) {
          psVar4 = std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>::get
                             (local_100);
          process_string_table(psVar4,(string *)local_38);
        }
        __gnu_cxx::
        __normal_iterator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_*,_std::vector<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>_>
        ::operator++(&__end1);
      }
      argv_local._4_4_ = 0;
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cerr,"File ");
      poVar3 = std::operator<<(poVar3,(string *)local_38);
      std::operator<<(poVar3," is not found or it is not an ELF file\n");
      argv_local._4_4_ = 1;
    }
    ELFIO::elfio::~elfio((elfio *)local_d8);
    std::__cxx11::string::~string((string *)local_38);
  }
  else {
    std::operator<<((ostream *)&std::cout,"Usage: anonymizer <file_name>\n");
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int main( int argc, char** argv )
{
    if ( argc != 2 ) {
        std::cout << "Usage: anonymizer <file_name>\n";
        return 1;
    }

    std::string filename = argv[1];

    elfio reader;

    if ( !reader.load( filename ) ) {
        std::cerr << "File " << filename
                  << " is not found or it is not an ELF file\n";
        return 1;
    }

    for ( const auto& section : reader.sections ) {
        if ( section->get_type() == SHT_STRTAB &&
             std::string( section->get_name() ) == std::string( ".strtab" ) ) {
            process_string_table( section.get(), filename );
        }
    }
    return 0;
}